

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall cmMakefile::GetRequiredDefinition(cmMakefile *this,string *name)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  cmMakefile *local_28;
  string *def;
  string *name_local;
  cmMakefile *this_local;
  
  def = name;
  name_local = (string *)this;
  if ((GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRequiredDefinition(std::__cxx11::string_const&)::
                                   empty_abi_cxx11_), iVar1 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_);
  }
  local_28 = (cmMakefile *)GetDef(this,def);
  this_local = local_28;
  if (local_28 == (cmMakefile *)0x0) {
    std::operator+(&local_48,
                   "Error required internal CMake variable not set, cmake may not be built correctly.\nMissing variable is:\n"
                   ,def);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    this_local = (cmMakefile *)&GetRequiredDefinition(std::__cxx11::string_const&)::empty_abi_cxx11_
    ;
  }
  return (string *)this_local;
}

Assistant:

const std::string& cmMakefile::GetRequiredDefinition(
  const std::string& name) const
{
  static std::string const empty;
  const std::string* def = GetDef(name);
  if (!def) {
    cmSystemTools::Error("Error required internal CMake variable not "
                         "set, cmake may not be built correctly.\n"
                         "Missing variable is:\n" +
                         name);
    return empty;
  }
  return *def;
}